

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTzTransition>::relocate
          (QArrayDataPointer<QTzTransition> *this,qsizetype offset,QTzTransition **data)

{
  bool bVar1;
  QTzTransition *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QTzTransition *res;
  
  first = (QTzTransition *)(*(long *)(in_RDI + 8) + in_RSI * 0x10);
  QtPrivate::q_relocate_overlap_n<QTzTransition,long_long>(first,in_RDI,(QTzTransition *)0x7579c7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QTzTransition>,QTzTransition_const*>
                        (data,(QArrayDataPointer<QTzTransition> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  *(QTzTransition **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }